

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * __thiscall
QStringBuilder<QStringBuilder<QString_&,_char>,_const_ProString_&>::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QString_&,_char>,_const_ProString_&> *this)

{
  int iVar1;
  long lVar2;
  char16_t *__dest;
  QString *pQVar3;
  ProString *pPVar4;
  CutResult CVar5;
  char16_t *pcVar6;
  char16_t *__src;
  long lVar7;
  long in_FS_OFFSET;
  long local_40;
  long local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (((this->a).a)->d).size;
  iVar1 = this->b->m_length;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,lVar2 + 1 + (long)iVar1,Uninitialized);
  __dest = (__return_storage_ptr__->d).ptr;
  pQVar3 = (this->a).a;
  lVar2 = (pQVar3->d).size;
  if (lVar2 != 0) {
    pcVar6 = (pQVar3->d).ptr;
    if (pcVar6 == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QString::_empty;
    }
    memcpy(__dest,pcVar6,lVar2 * 2);
  }
  __dest[lVar2] = (ushort)(byte)(this->a).b;
  pPVar4 = this->b;
  lVar7 = (long)pPVar4->m_length;
  if (lVar7 != 0) {
    pcVar6 = (pPVar4->m_string).d.ptr;
    local_38 = (long)pPVar4->m_offset;
    local_40 = lVar7;
    CVar5 = QtPrivate::QContainerImplHelper::mid((pPVar4->m_string).d.size,&local_38,&local_40);
    __src = (char16_t *)0x0;
    if (CVar5 != Null) {
      __src = pcVar6 + local_38;
    }
    memcpy(__dest + lVar2 + 1,__src,lVar7 * 2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }